

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O1

Pla_Man_t * Pla_ReadPla(char *pFileName)

{
  Pla_File_t PVar1;
  int iVar2;
  char *pBuffer;
  Vec_Str_t *__ptr;
  Pla_Man_t *p;
  size_t sVar3;
  int *piVar4;
  word *pwVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int nCubes;
  int Type;
  int nOuts;
  int nIns;
  char *pLimit;
  uint local_5c;
  Pla_File_t local_58;
  Pla_File_t local_54;
  uint local_50;
  uint local_4c;
  char *local_48;
  char *local_40;
  Vec_Str_t *local_38;
  
  pBuffer = Pla_ReadFile(pFileName,&local_40);
  pcVar6 = pBuffer;
  if (pBuffer == (char *)0x0) {
    p = (Pla_Man_t *)0x0;
  }
  else {
    for (; pcVar6 < local_40; pcVar6 = pcVar6 + 1) {
      if (*pcVar6 == '#') {
        for (; (*pcVar6 != '\0' && (*pcVar6 != '\n')); pcVar6 = pcVar6 + 1) {
          *pcVar6 = ' ';
        }
      }
    }
    iVar2 = Pla_ReadPlaHeader(pBuffer,local_40,(int *)&local_4c,(int *)&local_50,(int *)&local_5c,
                              (int *)&local_54);
    if (iVar2 == 0) {
      p = (Pla_Man_t *)0x0;
    }
    else {
      local_48 = pBuffer;
      __ptr = Pla_ReadPlaBody(pBuffer,local_40,local_54);
      if (__ptr->nSize % (int)(local_4c + local_50) == 0) {
        uVar9 = (long)__ptr->nSize / (long)(int)(local_4c + local_50) & 0xffffffff;
        local_58 = local_54;
        if (local_5c != 0xffffffff) {
          uVar9 = (ulong)local_5c;
        }
        uVar8 = (uint)uVar9;
        local_5c = uVar8;
        local_38 = __ptr;
        p = (Pla_Man_t *)calloc(1,0x98);
        pcVar6 = Extra_FileDesignName(pFileName);
        p->pName = pcVar6;
        if (pFileName == (char *)0x0) {
          pcVar6 = (char *)0x0;
        }
        else {
          sVar3 = strlen(pFileName);
          pcVar6 = (char *)malloc(sVar3 + 1);
          strcpy(pcVar6,pFileName);
        }
        p->pSpec = pcVar6;
        p->nIns = local_4c;
        p->nOuts = local_50;
        iVar2 = (((int)local_4c >> 5) + 1) - (uint)((local_4c & 0x1f) == 0);
        iVar11 = (((int)local_50 >> 5) + 1) - (uint)((local_50 & 0x1f) == 0);
        p->nInWords = iVar2;
        p->nOutWords = iVar11;
        if ((p->vCubes).nCap < (int)uVar8) {
          piVar4 = (p->vCubes).pArray;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)(int)uVar8 << 2);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)(int)uVar8 << 2);
          }
          (p->vCubes).pArray = piVar4;
          if (piVar4 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (p->vCubes).nCap = uVar8;
        }
        if (0 < (int)uVar8) {
          piVar4 = (p->vCubes).pArray;
          uVar7 = 0;
          do {
            piVar4[uVar7] = (int)uVar7;
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
        (p->vCubes).nSize = uVar8;
        uVar10 = iVar2 * uVar8;
        if ((p->vInBits).nCap < (int)uVar10) {
          pwVar5 = (p->vInBits).pArray;
          if (pwVar5 == (word *)0x0) {
            pwVar5 = (word *)malloc((long)(int)uVar10 << 3);
          }
          else {
            pwVar5 = (word *)realloc(pwVar5,(long)(int)uVar10 << 3);
          }
          (p->vInBits).pArray = pwVar5;
          if (pwVar5 == (word *)0x0) goto LAB_0037284c;
          (p->vInBits).nCap = uVar10;
        }
        if (0 < (int)uVar10) {
          memset((p->vInBits).pArray,0,(ulong)uVar10 << 3);
        }
        PVar1 = local_58;
        (p->vInBits).nSize = uVar10;
        uVar8 = uVar8 * iVar11;
        if ((p->vOutBits).nCap < (int)uVar8) {
          pwVar5 = (p->vOutBits).pArray;
          if (pwVar5 == (word *)0x0) {
            pwVar5 = (word *)malloc((long)(int)uVar8 << 3);
          }
          else {
            pwVar5 = (word *)realloc(pwVar5,(long)(int)uVar8 << 3);
          }
          (p->vOutBits).pArray = pwVar5;
          if (pwVar5 == (word *)0x0) {
LAB_0037284c:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          (p->vOutBits).nCap = uVar8;
        }
        if (0 < (int)uVar8) {
          memset((p->vOutBits).pArray,0,(ulong)uVar8 << 3);
        }
        __ptr = local_38;
        (p->vOutBits).nSize = uVar8;
        p->Type = PVar1;
        Pla_ReadAddBody(p,local_38);
        if (__ptr->pArray != (char *)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (char *)0x0;
        }
      }
      else {
        printf("Literal count is incorrect (in = %d; out = %d; lit = %d).\n",(ulong)local_4c,
               (ulong)local_50);
        if (__ptr->pArray != (char *)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (char *)0x0;
        }
        p = (Pla_Man_t *)0x0;
      }
      pBuffer = local_48;
      if (__ptr != (Vec_Str_t *)0x0) {
        free(__ptr);
      }
    }
    free(pBuffer);
  }
  return p;
}

Assistant:

Pla_Man_t * Pla_ReadPla( char * pFileName )
{   
    Pla_Man_t * p;
    Vec_Str_t * vLits;
    int nIns, nOuts, nCubes, Type;
    char * pBuffer, * pLimit;   
    pBuffer = Pla_ReadFile( pFileName, &pLimit );
    if ( pBuffer == NULL )
        return NULL;
    Pla_ReadPlaRemoveComments( pBuffer, pLimit );
    if ( Pla_ReadPlaHeader( pBuffer, pLimit, &nIns, &nOuts, &nCubes, &Type ) )
    {
        vLits = Pla_ReadPlaBody( pBuffer, pLimit, (Pla_File_t)Type );
        if ( Vec_StrSize(vLits) % (nIns + nOuts) == 0 )
        {
            if ( nCubes == -1 )
                nCubes = Vec_StrSize(vLits) / (nIns + nOuts);
            p = Pla_ManAlloc( pFileName, nIns, nOuts, nCubes );
            p->Type = (Pla_File_t)Type;
            Pla_ReadAddBody( p, vLits );
            Vec_StrFree( vLits );
            ABC_FREE( pBuffer );
            return p;
        }
        printf( "Literal count is incorrect (in = %d; out = %d; lit = %d).\n", nIns, nOuts, Vec_StrSize(vLits) );
        Vec_StrFree( vLits );
    }
    ABC_FREE( pBuffer );
    return NULL;
}